

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServerBase::OnDisconnect(cmServerBase *this,cmConnection *pConnection)

{
  __uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_> *p_Var1;
  const_iterator __first;
  size_t __n;
  long lVar2;
  void *__buf;
  int __fd;
  int in_R8D;
  const_iterator __last;
  
  uv_rwlock_wrlock(&this->ConnectionsMutex);
  p_Var1 = (__uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_> *)
           (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->Connections).
       super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)__last._M_current - (long)p_Var1;
  for (lVar2 = (long)__n >> 5; 0 < lVar2; lVar2 = lVar2 + -1) {
    __first._M_current = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)p_Var1;
    if ((p_Var1->_M_t).super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) goto LAB_00423688;
    if (p_Var1[1]._M_t.super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
      __first._M_current =
           (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)(p_Var1 + 1);
      goto LAB_00423688;
    }
    if (p_Var1[2]._M_t.super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
      __first._M_current =
           (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)(p_Var1 + 2);
      goto LAB_00423688;
    }
    if (p_Var1[3]._M_t.super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
      __first._M_current =
           (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)(p_Var1 + 3);
      goto LAB_00423688;
    }
    p_Var1 = p_Var1 + 4;
    __n = __n - 0x20;
  }
  __n = (long)__n >> 3;
  if (__n == 1) {
LAB_0042366f:
    __first._M_current = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)p_Var1;
    if ((p_Var1->_M_t).super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __first._M_current = __last._M_current;
    }
  }
  else if (__n == 2) {
LAB_00423666:
    __first._M_current = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)p_Var1;
    if ((p_Var1->_M_t).super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      p_Var1 = p_Var1 + 1;
      goto LAB_0042366f;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (__n != 3) goto LAB_004236d4;
    __first._M_current = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)p_Var1;
    if ((p_Var1->_M_t).super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      p_Var1 = p_Var1 + 1;
      goto LAB_00423666;
    }
  }
LAB_00423688:
  p_Var1 = (__uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_> *)__first._M_current;
  if (__first._M_current != __last._M_current) {
    while (__first._M_current =
                (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
                ((__uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_> *)
                 __first._M_current + 1), __first._M_current != __last._M_current) {
      if ((((__uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_> *)__first._M_current)
          ->_M_t).super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
        std::__uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>::operator=
                  (p_Var1,(__uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_> *)
                          __first._M_current);
        p_Var1 = p_Var1 + 1;
      }
    }
    __last._M_current =
         (this->Connections).
         super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)p_Var1;
  }
LAB_004236d4:
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::erase(&this->Connections,__first,__last);
  __fd = (int)__first._M_current;
  uv_rwlock_wrunlock(&this->ConnectionsMutex);
  if ((this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    auto_async_t::send(&this->ShutdownSignal,__fd,__buf,__n,in_R8D);
    return;
  }
  return;
}

Assistant:

void cmServerBase::OnDisconnect(cmConnection* pConnection)
{
  auto pred = [pConnection](const std::unique_ptr<cmConnection>& m) {
    return m.get() == pConnection;
  };
  uv_rwlock_wrlock(&ConnectionsMutex);
  Connections.erase(
    std::remove_if(Connections.begin(), Connections.end(), pred),
    Connections.end());
  uv_rwlock_wrunlock(&ConnectionsMutex);
  if (Connections.empty()) {
    this->ShutdownSignal.send();
  }
}